

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar1;
  DrawTest *pDVar2;
  long lVar3;
  TestNode *this_00;
  IndexType type;
  IndexType type_00;
  Storage storage;
  int *piVar4;
  long lVar5;
  bool bVar6;
  allocator<char> local_261;
  TestNode *local_260;
  IndexTest *local_258;
  MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> test;
  string iterationDesc;
  string desc;
  string name;
  DrawTestSpec spec;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  IndexTest tests [8];
  
  memcpy(tests,&DAT_009e8230,0xc0);
  deqp::gls::DrawTestSpec::DrawTestSpec(&spec);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"user_ptr",
             "user pointer");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_user_ptr","unaligned user pointer");
  local_260 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_260,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"buffer",
             "buffer");
  genBasicSpec(&spec,this->m_method);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,local_260);
  piVar4 = tests[0].offsets;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    bVar6 = tests[lVar3].aligned != false;
    pTVar1 = node_00;
    if (bVar6) {
      pTVar1 = node;
    }
    this_00 = (TestNode *)0x0;
    if (bVar6) {
      this_00 = local_260;
    }
    if (tests[lVar3].storage == STORAGE_USER) {
      this_00 = pTVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"index_",(allocator<char> *)&local_138);
    local_258 = tests + lVar3;
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&iterationDesc,(DrawTestSpec *)(ulong)tests[lVar3].type,type);
    std::operator+(&name,&desc,&iterationDesc);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"index ",&local_261);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)&test,(DrawTestSpec *)(ulong)local_258->type,type_00);
    std::operator+(&local_138,&local_158,(string *)&test);
    std::operator+(&iterationDesc,&local_138," in ");
    deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
              (&local_118,(DrawTestSpec *)(ulong)local_258->storage,storage);
    std::operator+(&desc,&iterationDesc,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&test);
    std::__cxx11::string::~string((string *)&local_158);
    pDVar2 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (pDVar2,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    spec.indexType = local_258->type;
    spec.indexStorage = local_258->storage;
    test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr
         = pDVar2;
    for (lVar5 = 0;
        (pDVar2 = test.
                  super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                  m_data.ptr, lVar5 != 0xc && (*(int *)((long)piVar4 + lVar5) != -1));
        lVar5 = lVar5 + 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"offset ",(allocator<char> *)&local_118);
      de::toString<int>(&local_158,(int *)((long)piVar4 + lVar5));
      std::operator+(&iterationDesc,&local_138,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_138);
      spec.indexPointerOffset = *(int *)((long)piVar4 + lVar5);
      deqp::gls::DrawTest::addIteration
                (test.
                 super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                 m_data.ptr,&spec,iterationDesc._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&iterationDesc);
    }
    test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr
         = (DrawTest *)0x0;
    tcu::TestNode::addChild(this_00,(TestNode *)pDVar2);
    de::details::UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::
    ~UniqueBase(&test.
                 super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    piVar4 = piVar4 + 6;
  }
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&spec.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_INT,	true,	{ 0, 4, -1 } },

		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },
		{ gls::DrawTestSpec::STORAGE_USER,		gls::DrawTestSpec::INDEXTYPE_INT,	false,	{ 2, 3, -1 } },

		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_BYTE,	true,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	true,	{ 0, 2, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_INT,	true,	{ 0, 4, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* userPtrGroup			= new tcu::TestCaseGroup(m_testCtx, "user_ptr", "user pointer");
	tcu::TestCaseGroup* unalignedUserPtrGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_user_ptr", "unaligned user pointer");
	tcu::TestCaseGroup* bufferGroup				= new tcu::TestCaseGroup(m_testCtx, "buffer", "buffer");

	genBasicSpec(spec, m_method);

	this->addChild(userPtrGroup);
	this->addChild(unalignedUserPtrGroup);
	this->addChild(bufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];
		tcu::TestCaseGroup*				group		= (indexTest.storage == gls::DrawTestSpec::STORAGE_USER)
													? ((indexTest.aligned) ? (userPtrGroup) : (unalignedUserPtrGroup))
													: ((indexTest.aligned) ? (bufferGroup) : (DE_NULL));

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET);
		DE_ASSERT(spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}